

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O0

int __thiscall
raspicam::_private::Private_Impl::open(Private_Impl *this,char *__file,int __oflag,...)

{
  byte bVar1;
  MMAL_COMPONENT_T *pMVar2;
  ostream *poVar3;
  undefined7 extraout_var;
  RASPIVID_STATE *in_stack_00000030;
  Private_Impl *in_stack_00000038;
  undefined7 in_stack_ffffffffffffffe8;
  bool local_1;
  
  bVar1 = (byte)__file & 1;
  if ((this->_isOpened & 1U) == 0) {
    pMVar2 = create_camera_component(in_stack_00000038,in_stack_00000030);
    if (pMVar2 == (MMAL_COMPONENT_T *)0x0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"open");
      poVar3 = std::operator<<(poVar3," Failed to create camera component");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/rmsalinas[P]raspicam/src/private/private_impl.cpp"
                              );
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x66);
      this = (Private_Impl *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>)
      ;
      local_1 = false;
    }
    else {
      commitParameters(this);
      this->camera_video_port = ((this->State).camera_component)->output[1];
      (this->callback_data).pstate = &this->State;
      this->camera_video_port->userdata = (MMAL_PORT_USERDATA_T *)&this->callback_data;
      this->_isOpened = true;
      if ((bVar1 & 1) == 0) {
        local_1 = true;
      }
      else {
        local_1 = startCapture((Private_Impl *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
        this = (Private_Impl *)CONCAT71(extraout_var,local_1);
      }
    }
  }
  else {
    local_1 = false;
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),local_1);
}

Assistant:

bool  Private_Impl::open ( bool StartCapture ) {
            if ( _isOpened ) return false; //already opened
// create camera
            if ( ! create_camera_component ( &State ) ) {
                cerr<<__func__<<" Failed to create camera component"<<__FILE__<<" "<<__LINE__<<endl;
                return false;
            }
            commitParameters();
            camera_video_port   = State.camera_component->output[MMAL_CAMERA_VIDEO_PORT];
            callback_data.pstate = &State;
            // assign data to use for callback
            camera_video_port->userdata = ( struct MMAL_PORT_USERDATA_T * ) &callback_data;

            _isOpened=true;
            if ( StartCapture ) return startCapture();
            else return true;
        }